

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::MaxMemorySetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  idx_t iVar1;
  BufferManager *pBVar2;
  string local_38;
  
  Value::ToString_abi_cxx11_(&local_38,input);
  iVar1 = DBConfig::ParseMemoryLimit(&local_38);
  (config->options).maximum_memory = iVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (db != (DatabaseInstance *)0x0) {
    pBVar2 = BufferManager::GetBufferManager(db);
    (*pBVar2->_vptr_BufferManager[0x18])(pBVar2,(config->options).maximum_memory);
  }
  return;
}

Assistant:

void MaxMemorySetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.maximum_memory = DBConfig::ParseMemoryLimit(input.ToString());
	if (db) {
		BufferManager::GetBufferManager(*db).SetMemoryLimit(config.options.maximum_memory);
	}
}